

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encodeframe_utils.h
# Opt level: O2

void av1_dealloc_mb_data(macroblock *mb,int num_planes)

{
  aom_free((mb->txfm_search_info).mb_rd_record);
  (mb->txfm_search_info).mb_rd_record = (MB_RD_RECORD *)0x0;
  aom_free(mb->inter_modes_info);
  mb->inter_modes_info = (inter_modes_info *)0x0;
  av1_dealloc_src_diff_buf(mb,num_planes);
  aom_free((mb->e_mbd).seg_mask);
  (mb->e_mbd).seg_mask = (uint8_t *)0x0;
  aom_free(mb->winner_mode_stats);
  mb->winner_mode_stats = (WinnerModeStats *)0x0;
  aom_free(mb->dqcoeff_buf);
  mb->dqcoeff_buf = (tran_low_t *)0x0;
  return;
}

Assistant:

static inline void av1_dealloc_mb_data(struct macroblock *mb, int num_planes) {
  aom_free(mb->txfm_search_info.mb_rd_record);
  mb->txfm_search_info.mb_rd_record = NULL;

  aom_free(mb->inter_modes_info);
  mb->inter_modes_info = NULL;

  av1_dealloc_src_diff_buf(mb, num_planes);

  aom_free(mb->e_mbd.seg_mask);
  mb->e_mbd.seg_mask = NULL;

  aom_free(mb->winner_mode_stats);
  mb->winner_mode_stats = NULL;

  aom_free(mb->dqcoeff_buf);
  mb->dqcoeff_buf = NULL;
}